

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCommands
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  OutputOption outputflag;
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference command;
  ostream *poVar4;
  string local_6e0 [32];
  undefined1 local_6c0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_548 [8];
  cmGeneratedFileStream ofs;
  string local_2f8;
  undefined1 local_2d8 [8];
  string tmpFile;
  int local_2ac;
  undefined1 local_2a8 [3];
  bool resB;
  int retVal;
  string output;
  undefined1 local_268 [8];
  ostringstream cmCPackLog_msg;
  string *ic;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_c8;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installCommandsVector;
  undefined1 local_88 [8];
  string tempInstallDirectoryEnv;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *installCommands;
  string *tempInstallDirectory_local;
  cmCPackGenerator *pcStack_18;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  installCommands = (char *)tempInstallDirectory;
  tempInstallDirectory_local._7_1_ = setDestDir;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CPACK_INSTALL_COMMANDS",&local_51);
  pcVar3 = GetOption(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    local_30 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"CMAKE_INSTALL_PREFIX=",
               (allocator<char> *)
               ((long)&installCommandsVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&installCommandsVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator+=((string *)local_88,(string *)installCommands);
    cmsys::SystemTools::PutEnv((string *)local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
    pcVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,pcVar3,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,false);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8);
    ic = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ic), bVar2) {
      command = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      poVar4 = std::operator<<((ostream *)local_268,"Execute: ");
      poVar4 = std::operator<<(poVar4,(string *)command);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x116,pcVar3);
      std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::__cxx11::string::string((string *)local_2a8);
      local_2ac = 1;
      outputflag = this->GeneratorVerbose;
      tmpFile.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar2 = cmSystemTools::RunSingleCommand
                        (command,(string *)local_2a8,(string *)local_2a8,&local_2ac,(char *)0x0,
                         outputflag,(cmDuration)tmpFile.field_2._8_8_);
      if ((bVar2) && (local_2ac == 0)) {
        bVar2 = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"CPACK_TOPLEVEL_DIRECTORY",
                   (allocator<char> *)&ofs.field_0x247);
        pcVar3 = GetOption(this,&local_2f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2d8,pcVar3,(allocator<char> *)&ofs.field_0x246);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x246);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
        std::__cxx11::string::operator+=((string *)local_2d8,"/InstallOutput.log");
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_548,(string *)local_2d8,false,None);
        poVar4 = std::operator<<((ostream *)local_548,"# Run command: ");
        poVar4 = std::operator<<(poVar4,(string *)command);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"# Output:");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,(string *)local_2a8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
        poVar4 = std::operator<<((ostream *)local_6c0,"Problem running install command: ");
        poVar4 = std::operator<<(poVar4,(string *)command);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"Please check ");
        poVar4 = std::operator<<(poVar4,(string *)local_2d8);
        poVar4 = std::operator<<(poVar4," for errors");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x127,pcVar3);
        std::__cxx11::string::~string(local_6e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
        this_local._4_4_ = 0;
        bVar2 = true;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_548);
        std::__cxx11::string::~string((string *)local_2d8);
      }
      std::__cxx11::string::~string((string *)local_2a8);
      if (bVar2) goto LAB_0014edb4;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = false;
LAB_0014edb4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    std::__cxx11::string::~string((string *)local_88);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCommands(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  const char* installCommands = this->GetOption("CPACK_INSTALL_COMMANDS");
  if (installCommands && *installCommands) {
    std::string tempInstallDirectoryEnv = "CMAKE_INSTALL_PREFIX=";
    tempInstallDirectoryEnv += tempInstallDirectory;
    cmSystemTools::PutEnv(tempInstallDirectoryEnv);
    std::vector<std::string> installCommandsVector;
    cmSystemTools::ExpandListArgument(installCommands, installCommandsVector);
    for (std::string const& ic : installCommandsVector) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ic << std::endl);
      std::string output;
      int retVal = 1;
      bool resB = cmSystemTools::RunSingleCommand(
        ic, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
        cmDuration::zero());
      if (!resB || retVal) {
        std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
        tmpFile += "/InstallOutput.log";
        cmGeneratedFileStream ofs(tmpFile);
        ofs << "# Run command: " << ic << std::endl
            << "# Output:" << std::endl
            << output << std::endl;
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem running install command: "
                        << ic << std::endl
                        << "Please check " << tmpFile << " for errors"
                        << std::endl);
        return 0;
      }
    }
  }
  return 1;
}